

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_183fe20::AV1FrameSizeTests::~AV1FrameSizeTests(AV1FrameSizeTests *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~AV1FrameSizeTests() override = default;